

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder.h
# Opt level: O3

NodeRef __thiscall
embree::sse2::BVHNBuilderVirtual<4>::BVHNBuilderT<embree::sse2::CreateLeaf<4,_embree::QuadMi<4>_>_>
::createLeaf(BVHNBuilderT<embree::sse2::CreateLeaf<4,_embree::QuadMi<4>_>_> *this,PrimRef *prims,
            range<unsigned_long> *set,Allocator *alloc)

{
  atomic<unsigned_long> *paVar1;
  pointer *pppTVar2;
  float fVar3;
  float fVar4;
  ThreadLocal2 *this_00;
  iterator __position;
  Scene *pSVar5;
  Geometry *pGVar6;
  long lVar7;
  undefined8 *puVar8;
  __pointer_type pFVar9;
  undefined8 *puVar10;
  undefined4 uVar11;
  ulong uVar12;
  char *pcVar13;
  size_t sVar14;
  ulong uVar15;
  long lVar16;
  unsigned_long uVar17;
  PrimRef *pPVar18;
  long lVar19;
  uint uVar20;
  long lVar21;
  ThreadLocal *pTVar22;
  vuint<4> geomID;
  vuint<4> primID;
  vuint<4> v1;
  vuint<4> v0;
  vuint<4> v2;
  undefined8 *local_b8;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  ulong local_a8;
  __pointer_type local_a0;
  ThreadLocal2 *local_98;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined8 *local_88;
  undefined8 uStack_80;
  ThreadLocal2 *local_78;
  undefined8 uStack_70;
  ulong local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  ThreadLocal *local_38;
  
  uVar17 = set->_begin;
  local_a8 = (set->_end - uVar17) + 3;
  local_60 = local_a8 >> 2;
  local_88 = (undefined8 *)(local_60 * 0x60);
  local_a0 = alloc->alloc;
  pTVar22 = alloc->talloc1;
  this_00 = pTVar22->parent;
  if (local_a0 != (this_00->alloc)._M_b._M_p) {
    uStack_90 = CONCAT31(uStack_90._1_3_,1);
    local_98 = this_00;
    local_38 = pTVar22;
    MutexSys::lock(&this_00->mutex);
    pFVar9 = local_a0;
    if ((this_00->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_00->alloc1).bytesUsed + (this_00->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_00->alloc0).end + (this_00->alloc1).end) -
           ((this_00->alloc0).cur + (this_00->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_00->alloc1).bytesWasted + (this_00->alloc0).bytesWasted;
      UNLOCK();
    }
    (this_00->alloc0).bytesUsed = 0;
    (this_00->alloc0).bytesWasted = 0;
    (this_00->alloc0).end = 0;
    (this_00->alloc0).allocBlockSize = 0;
    (this_00->alloc0).ptr = (char *)0x0;
    (this_00->alloc0).cur = 0;
    if (local_a0 == (__pointer_type)0x0) {
      (this_00->alloc1).bytesUsed = 0;
      (this_00->alloc1).bytesWasted = 0;
      (this_00->alloc1).end = 0;
      (this_00->alloc1).allocBlockSize = 0;
      (this_00->alloc1).ptr = (char *)0x0;
      (this_00->alloc1).cur = 0;
    }
    else {
      (this_00->alloc0).allocBlockSize = local_a0->defaultBlockSize;
      (this_00->alloc1).ptr = (char *)0x0;
      (this_00->alloc1).cur = 0;
      (this_00->alloc1).end = 0;
      (this_00->alloc1).allocBlockSize = 0;
      (this_00->alloc1).bytesUsed = 0;
      (this_00->alloc1).bytesWasted = 0;
      (this_00->alloc1).allocBlockSize = local_a0->defaultBlockSize;
    }
    LOCK();
    (this_00->alloc)._M_b._M_p = local_a0;
    UNLOCK();
    local_b8 = &FastAllocator::s_thread_local_allocators_lock;
    uStack_b0 = CONCAT31(uStack_b0._1_3_,1);
    local_78 = this_00;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    __position._M_current =
         (pFVar9->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (pFVar9->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&pFVar9->thread_local_allocators,__position,&local_78);
    }
    else {
      *__position._M_current = this_00;
      pppTVar2 = &(pFVar9->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar2 = *pppTVar2 + 1;
    }
    MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    pTVar22 = local_38;
    if ((char)uStack_90 == '\x01') {
      MutexSys::unlock(&local_98->mutex);
    }
  }
  puVar10 = local_88;
  pTVar22->bytesUsed = pTVar22->bytesUsed + (long)local_88;
  sVar14 = pTVar22->cur;
  uVar15 = (ulong)(-(int)sVar14 & 0xf);
  uVar12 = (long)local_88 + uVar15 + sVar14;
  pTVar22->cur = uVar12;
  if (pTVar22->end < uVar12) {
    pTVar22->cur = sVar14;
    puVar8 = (undefined8 *)pTVar22->allocBlockSize;
    if ((undefined8 *)((long)local_88 * 4) < puVar8 || (long)local_88 * 4 - (long)puVar8 == 0) {
      local_b8 = puVar8;
      pcVar13 = (char *)FastAllocator::malloc(local_a0,(size_t)&local_b8);
      pTVar22->ptr = pcVar13;
      sVar14 = (pTVar22->end - pTVar22->cur) + pTVar22->bytesWasted;
      pTVar22->bytesWasted = sVar14;
      pTVar22->end = (size_t)local_b8;
      pTVar22->cur = (size_t)puVar10;
      if (local_b8 < puVar10) {
        pTVar22->cur = 0;
        local_b8 = (undefined8 *)pTVar22->allocBlockSize;
        pcVar13 = (char *)FastAllocator::malloc(local_a0,(size_t)&local_b8);
        pTVar22->ptr = pcVar13;
        sVar14 = (pTVar22->end - pTVar22->cur) + pTVar22->bytesWasted;
        pTVar22->bytesWasted = sVar14;
        pTVar22->end = (size_t)local_b8;
        pTVar22->cur = (size_t)puVar10;
        if (local_b8 < puVar10) {
          pTVar22->cur = 0;
          pcVar13 = (char *)0x0;
        }
        else {
          pTVar22->bytesWasted = sVar14;
        }
      }
      else {
        pTVar22->bytesWasted = sVar14;
      }
    }
    else {
      pcVar13 = (char *)FastAllocator::malloc(local_a0,(size_t)&local_88);
    }
  }
  else {
    pTVar22->bytesWasted = pTVar22->bytesWasted + uVar15;
    pcVar13 = pTVar22->ptr + (uVar12 - (long)local_88);
  }
  if (3 < local_a8) {
    lVar16 = 0;
    do {
      uVar12 = set->_end;
      pSVar5 = ((this->createLeafFunc).bvh)->scene;
      local_b8 = (undefined8 *)0xffffffffffffffff;
      uStack_b0 = 0xffffffff;
      uStack_ac = 0xffffffff;
      local_98 = (ThreadLocal2 *)0xffffffffffffffff;
      uStack_90 = 0xffffffff;
      uStack_8c = 0xffffffff;
      pPVar18 = prims + uVar17;
      local_78 = (ThreadLocal2 *)0x0;
      uStack_70 = 0;
      local_88 = (undefined8 *)0x0;
      uStack_80 = 0;
      local_48 = 0;
      uStack_40 = 0;
      local_58 = 0;
      uStack_50 = 0;
      lVar19 = 0;
      do {
        if (uVar17 < uVar12) {
          fVar3 = (pPVar18->lower).field_0.m128[3];
          *(float *)((long)&local_b8 + lVar19) = fVar3;
          fVar4 = (pPVar18->upper).field_0.m128[3];
          *(float *)((long)&local_98 + lVar19) = fVar4;
          pGVar6 = (pSVar5->geometries).items[(uint)fVar3].ptr;
          lVar21 = (ulong)(uint)fVar4 *
                   pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
          lVar7 = *(long *)&pGVar6->field_0x58;
          uVar20 = *(uint *)&pGVar6[1].intersectionFilterN >> 2;
          *(uint *)((long)&local_78 + lVar19) = *(int *)(lVar7 + lVar21) * uVar20;
          *(uint *)((long)&local_88 + lVar19) = *(int *)(lVar7 + 4 + lVar21) * uVar20;
          *(uint *)((long)&local_48 + lVar19) = *(int *)(lVar7 + 8 + lVar21) * uVar20;
          *(uint *)((long)&local_58 + lVar19) = uVar20 * *(int *)(lVar7 + 0xc + lVar21);
          uVar17 = uVar17 + 1;
        }
        else if (lVar19 != 0) {
          *(undefined4 *)((long)&local_b8 + lVar19) = local_b8._0_4_;
          *(undefined4 *)((long)&local_98 + lVar19) = 0xffffffff;
          uVar11 = local_78._0_4_;
          *(undefined4 *)((long)&local_78 + lVar19) = local_78._0_4_;
          *(undefined4 *)((long)&local_88 + lVar19) = uVar11;
          *(undefined4 *)((long)&local_48 + lVar19) = uVar11;
          *(undefined4 *)((long)&local_58 + lVar19) = uVar11;
        }
        if (uVar17 < uVar12) {
          pPVar18 = prims + uVar17;
        }
        lVar19 = lVar19 + 4;
      } while (lVar19 != 0x10);
      lVar19 = lVar16 * 0x60;
      *(ThreadLocal2 **)(pcVar13 + lVar19) = local_78;
      *(undefined8 *)(pcVar13 + lVar19 + 8) = uStack_70;
      *(undefined8 **)(pcVar13 + lVar19 + 0x10) = local_88;
      *(undefined8 *)(pcVar13 + lVar19 + 0x10 + 8) = uStack_80;
      *(undefined8 *)(pcVar13 + lVar19 + 0x20) = local_48;
      *(undefined8 *)(pcVar13 + lVar19 + 0x20 + 8) = uStack_40;
      *(undefined8 *)(pcVar13 + lVar19 + 0x30) = local_58;
      *(undefined8 *)(pcVar13 + lVar19 + 0x30 + 8) = uStack_50;
      *(undefined8 **)(pcVar13 + lVar19 + 0x40) = local_b8;
      *(ulong *)(pcVar13 + lVar19 + 0x40 + 8) = CONCAT44(uStack_ac,uStack_b0);
      *(ThreadLocal2 **)(pcVar13 + lVar19 + 0x50) = local_98;
      *(ulong *)(pcVar13 + lVar19 + 0x50 + 8) = CONCAT44(uStack_8c,uStack_90);
      lVar16 = lVar16 + 1;
    } while (lVar16 != local_60 + (local_60 == 0));
  }
  uVar12 = 7;
  if (local_60 < 7) {
    uVar12 = local_60;
  }
  return (NodeRef)(uVar12 | (ulong)pcVar13 | 8);
}

Assistant:

NodeRef createLeaf (const PrimRef* prims, const range<size_t>& set, const Allocator& alloc) {
            return createLeafFunc(prims,set,alloc);
          }